

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

PCMSegment *
Storage::Encodings::AppleGCR::Macintosh::header
          (PCMSegment *__return_storage_ptr__,uint8_t type,uint8_t track,uint8_t sector,
          bool side_two)

{
  uint uVar1;
  size_t c;
  long lVar2;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data,0xb,&local_49);
  *data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0xd5;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0xaa;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0x96;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = track & 0x3f;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = sector;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = track >> 6 | side_two << 5;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = type;
  uVar1 = *(uint *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + 3) >> 0x10 ^
          *(uint *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + 3);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = (byte)(uVar1 >> 8) ^ (byte)uVar1;
  for (lVar2 = 3; lVar2 != 8; lVar2 = lVar2 + 1) {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar2] =
         (anonymous_namespace)::six_and_two_mapping
         [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2]];
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = 0xde;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0xaa;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0xeb;
  Disk::PCMSegment::PCMSegment(__return_storage_ptr__,&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Storage::Disk::PCMSegment AppleGCR::Macintosh::header(uint8_t type, uint8_t track, uint8_t sector, bool side_two) {
	std::vector<uint8_t> data(11);

	// The standard prologue.
	data[0] = header_prologue[0];
	data[1] = header_prologue[1];
	data[2] = header_prologue[2];

	// There then follows:
	//
	//	1) the low six bits of the track number;
	//	2) the sector number;
	//	3) the high five bits of the track number plus a side flag;
	//	4) the type; and
	//	5) the XOR of all those fields.
	//
	//	(all two-and-six encoded).
	data[3] = track&0x3f;
	data[4] = sector;
	data[5] = (side_two ? 0x20 : 0x00) | ((track >> 6) & 0x1f);
	data[6] = type;
	data[7] = data[3] ^ data[4] ^ data[5] ^ data[6];

	for(size_t c = 3; c < 8; ++c) {
		data[c] = six_and_two_mapping[data[c]];
	}

	// Then the standard epilogue.
	data[8] = epilogue[0];
	data[9] = epilogue[1];
	data[10] = epilogue[2];

	return Storage::Disk::PCMSegment(data);
}